

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O0

vector<short,_std::allocator<short>_> *
utility::random_vector<short>
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,size_t size,short min,
          short max)

{
  anon_class_16_2_a39a3d48 __gen;
  iterator __first;
  size_type __n;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  default_random_engine generator;
  uniform_int_distribution<short> uniform;
  allocator<short> local_1e;
  undefined1 local_1d;
  short local_1c;
  short local_1a;
  short max_local;
  size_t sStack_18;
  short min_local;
  size_t size_local;
  vector<short,_std::allocator<short>_> *numbers;
  
  local_1d = 0;
  local_1c = max;
  local_1a = min;
  sStack_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<short>::allocator(&local_1e);
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,size,&local_1e);
  std::allocator<short>::~allocator(&local_1e);
  std::uniform_int_distribution<short>::uniform_int_distribution
            ((uniform_int_distribution<short> *)&generator,local_1a,local_1c);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_38);
  __first = std::vector<short,_std::allocator<short>_>::begin(__return_storage_ptr__);
  __n = std::vector<short,_std::allocator<short>_>::size(__return_storage_ptr__);
  __gen.generator = &local_38;
  __gen.uniform = (uniform_int_distribution<short> *)&generator;
  std::
  generate_n<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,unsigned_long,utility::random_vector<short>(unsigned_long,short,short)::_lambda()_1_>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,__n,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }